

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O1

Token * __thiscall toml::internal::Lexer::nextKey(Token *__return_storage_ptr__,Lexer *this)

{
  uint uVar1;
  int iVar2;
  string s;
  long *local_70;
  long local_68;
  long local_60 [2];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_48 = 0;
  local_40 = 0;
  local_50 = &local_40;
  while (uVar1 = std::istream::peek(), uVar1 != 0xffffffff) {
    iVar2 = isalnum((int)(char)uVar1);
    if (((iVar2 == 0) && ((char)uVar1 != '_')) && ((uVar1 & 0xff) != 0x2d)) break;
    std::__cxx11::string::push_back((char)&local_50);
    iVar2 = std::istream::get();
    if (iVar2 == 10) {
      this->lineNo_ = this->lineNo_ + 1;
    }
  }
  if (local_48 == 0) {
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Unknown key format","");
    __return_storage_ptr__->type_ = ERROR_TOKEN;
    (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->str_value_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->str_value_,local_70,local_68 + (long)local_70);
    (__return_storage_ptr__->time_value_).__d.__r = 0;
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
  }
  else {
    __return_storage_ptr__->type_ = IDENT;
    (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->str_value_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->str_value_,local_50,local_50 + local_48);
    (__return_storage_ptr__->time_value_).__d.__r = 0;
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Token Lexer::nextKey()
{
    std::string s;
    char c;
    while (current(&c) && (isalnum(c) || c == '_' || c == '-')) {
        s += c;
        next();
    }

    if (s.empty())
        return Token(TokenType::ERROR_TOKEN, std::string("Unknown key format"));

    return Token(TokenType::IDENT, s);
}